

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnSegmentInfo
          (BinaryReaderObjdump *this,Index index,string_view name,Address alignment_log2,
          uint32_t flags)

{
  uint uVar1;
  Enum EVar2;
  ulong uVar3;
  
  uVar3 = (ulong)flags;
  PrintDetails(this,"   - %d: %.*s p2align=%lu",index,name._M_len,name._M_str,alignment_log2);
  if (flags < 0x200) {
    PrintDetails(this," [");
    if ((flags & 1) != 0) {
      PrintDetails(this," STRINGS");
      uVar3 = (ulong)(flags & 0x1fe);
    }
    uVar1 = (uint)uVar3;
    if ((uVar3 & 2) != 0) {
      PrintDetails(this," TLS");
      uVar1 = uVar1 & 0x1fd;
    }
    if (uVar1 != 0) {
      PrintDetails(this," unknown_flags=%#x",(ulong)uVar1);
    }
    EVar2 = Ok;
    PrintDetails(this," ]\n");
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Unknown symbols flags: %x\n",uVar3);
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderObjdump::OnSegmentInfo(Index index,
                                          std::string_view name,
                                          Address alignment_log2,
                                          uint32_t flags) {
  PrintDetails("   - %d: " PRIstringview " p2align=%" PRIaddress, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), alignment_log2);
  return PrintSegmentFlags(flags);
}